

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O1

void __thiscall ProblemFireFighting::FillRewardModel(ProblemFireFighting *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  lVar1 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscrete.
                                 super_MultiAgentDecisionProcess + 0x30))();
  if (lVar1 != 0) {
    uVar5 = 0;
    do {
      lVar1 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                     super_MultiAgentDecisionProcessDiscrete.
                                     super_MultiAgentDecisionProcess + 0x70))(this);
      if (lVar1 != 0) {
        uVar4 = 0;
        do {
          lVar1 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                         super_MultiAgentDecisionProcessDiscrete.
                                         super_MultiAgentDecisionProcess + 0x30))(this);
          if (lVar1 != 0) {
            uVar3 = 0;
            do {
              ComputeReward(this,(Index)uVar3);
              (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                     super_MultiAgentDecisionProcessDiscrete.
                                     super_MultiAgentDecisionProcess + 0x188))
                        (this,uVar5,uVar4,uVar3);
              uVar3 = (ulong)((Index)uVar3 + 1);
              uVar2 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                             super_MultiAgentDecisionProcessDiscrete.
                                             super_MultiAgentDecisionProcess + 0x30))(this);
            } while (uVar3 < uVar2);
          }
          uVar4 = (ulong)((int)uVar4 + 1);
          uVar3 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                         super_MultiAgentDecisionProcessDiscrete.
                                         super_MultiAgentDecisionProcess + 0x70))(this);
        } while (uVar4 < uVar3);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      uVar4 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                     super_MultiAgentDecisionProcessDiscrete.
                                     super_MultiAgentDecisionProcess + 0x30))(this);
    } while (uVar5 < uVar4);
  }
  return;
}

Assistant:

void ProblemFireFighting::FillRewardModel()
{    

    for(Index s1=0; s1<GetNrStates();s1++) 
        for(Index ja=0; ja<GetNrJointActions(); ja++)
            for(Index s2=0; s2<GetNrStates();s2++) 
            {
                double r = ComputeReward(s2);
                SetReward(s1, ja, s2, r);
            }
}